

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute __thiscall pugi::xml_node::prepend_copy(xml_node *this,xml_attribute *proto)

{
  xml_attribute_struct *in_RAX;
  char *source;
  char_t *pcVar1;
  xml_attribute result;
  xml_attribute local_18;
  
  if (proto->_attr == (xml_attribute_struct *)0x0) {
    local_18._attr = in_RAX;
    xml_attribute::xml_attribute(&local_18);
  }
  else {
    pcVar1 = proto->_attr->name;
    if (pcVar1 == (char_t *)0x0) {
      pcVar1 = "";
    }
    local_18 = prepend_attribute(this,pcVar1);
    source = "";
    if (proto->_attr != (xml_attribute_struct *)0x0) {
      pcVar1 = proto->_attr->value;
      source = "";
      if (pcVar1 != (char_t *)0x0) {
        source = pcVar1;
      }
    }
    if (local_18._attr != (xml_attribute_struct *)0x0) {
      impl::anon_unknown_0::strcpy_insitu
                (&(local_18._attr)->value,&(local_18._attr)->header,8,source);
    }
  }
  return (xml_attribute)local_18._attr;
}

Assistant:

PUGI__FN bool xml_attribute::operator!() const
	{
		return !_attr;
	}